

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_sample.cpp
# Opt level: O0

OperatorResultType __thiscall
duckdb::PhysicalStreamingSample::Execute
          (PhysicalStreamingSample *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk
          ,GlobalOperatorState *gstate,OperatorState *state)

{
  pointer pSVar1;
  InternalException *this_00;
  DataChunk *in_RCX;
  DataChunk *in_RDX;
  PhysicalStreamingSample *in_RSI;
  DataChunk *in_RDI;
  OperatorState *in_R8;
  string *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
  *in_stack_ffffffffffffff80;
  OperatorState *in_stack_ffffffffffffff88;
  allocator *paVar2;
  ushort in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  PhysicalStreamingSample *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [40];
  
  pSVar1 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->(in_stack_ffffffffffffff80);
  if (pSVar1->method == SYSTEM_SAMPLE) {
    SystemSample(in_stack_ffffffffffffffa0,
                 (DataChunk *)
                 CONCAT44(in_stack_ffffffffffffff9c,
                          CONCAT13(in_stack_ffffffffffffff9b,(uint3)in_stack_ffffffffffffff98)),
                 in_RDI,in_stack_ffffffffffffff88);
  }
  else {
    if (pSVar1->method != BERNOULLI_SAMPLE) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar2 = &local_51;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_50,"Unsupported sample method for streaming sample",paVar2);
      InternalException::InternalException(this_00,in_stack_ffffffffffffff78);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    BernoulliSample(in_RSI,in_RDX,in_RCX,in_R8);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalStreamingSample::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                    GlobalOperatorState &gstate, OperatorState &state) const {
	switch (sample_options->method) {
	case SampleMethod::BERNOULLI_SAMPLE:
		BernoulliSample(input, chunk, state);
		break;
	case SampleMethod::SYSTEM_SAMPLE:
		SystemSample(input, chunk, state);
		break;
	default:
		throw InternalException("Unsupported sample method for streaming sample");
	}
	return OperatorResultType::NEED_MORE_INPUT;
}